

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O0

int debug_lock_lock(uint mode,void *lock_)

{
  int local_24;
  int res;
  debug_lock *lock;
  void *lock__local;
  uint mode_local;
  
  local_24 = 0;
  if ((*(uint *)((long)lock_ + 4) & 2) == 0) {
    if ((mode & 0xc) != 0) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
                 ,0x101,"(mode & (EVTHREAD_READ|EVTHREAD_WRITE)) == 0","debug_lock_lock");
    }
  }
  else if ((mode & 0xc) == 0) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
               ,0xff,"mode & (EVTHREAD_READ|EVTHREAD_WRITE)","debug_lock_lock");
  }
  if (original_lock_fns_.lock != (_func_int_uint_void_ptr *)0x0) {
    local_24 = (*original_lock_fns_.lock)(mode,*(void **)((long)lock_ + 0x18));
  }
  if (local_24 == 0) {
    evthread_debug_lock_mark_locked(mode,(debug_lock *)lock_);
  }
  return local_24;
}

Assistant:

static int
debug_lock_lock(unsigned mode, void *lock_)
{
	struct debug_lock *lock = lock_;
	int res = 0;
	if (lock->locktype & EVTHREAD_LOCKTYPE_READWRITE)
		EVUTIL_ASSERT(mode & (EVTHREAD_READ|EVTHREAD_WRITE));
	else
		EVUTIL_ASSERT((mode & (EVTHREAD_READ|EVTHREAD_WRITE)) == 0);
	if (original_lock_fns_.lock)
		res = original_lock_fns_.lock(mode, lock->lock);
	if (!res) {
		evthread_debug_lock_mark_locked(mode, lock);
	}
	return res;
}